

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O0

int stb_ps_writelist(stb_ps *ps,void **list,int size)

{
  int iVar1;
  int local_54;
  stb_ps_hash *h;
  stb_ps_array *a;
  stb_ps_bucket *b;
  int local_28;
  int n;
  int i;
  int size_local;
  void **list_local;
  stb_ps *ps_local;
  
  b._4_4_ = 0;
  list_local._0_4_ = (uint)ps;
  switch((uint)list_local & 3) {
  case 0:
    if ((ps == (stb_ps *)0x0) || (size < 1)) {
      ps_local._4_4_ = 0;
    }
    else {
      *list = ps;
      ps_local._4_4_ = 1;
    }
    break;
  case 1:
    for (local_28 = 0; local_28 < 4; local_28 = local_28 + 1) {
      if ((*(long *)(ps + (long)local_28 * 8 + -1) != 0) && (b._4_4_ < size)) {
        list[b._4_4_] = *(void **)(ps + (long)local_28 * 8 + -1);
        b._4_4_ = b._4_4_ + 1;
      }
    }
    ps_local._4_4_ = b._4_4_;
    break;
  case 2:
    local_54 = size;
    if (*(int *)(ps + -2) <= size) {
      local_54 = *(int *)(ps + -2);
    }
    memcpy(list,ps + 6,(long)local_54 << 3);
    ps_local._4_4_ = local_54;
    break;
  case 3:
    if (size < 1) {
      ps_local._4_4_ = 0;
    }
    else {
      for (local_28 = 0; local_28 < *(int *)(ps + 5); local_28 = local_28 + 1) {
        if (1 < (uint)*(undefined8 *)(ps + (long)local_28 * 8 + 0x1d)) {
          iVar1 = b._4_4_ + 1;
          list[b._4_4_] = *(void **)(ps + (long)local_28 * 8 + 0x1d);
          b._4_4_ = iVar1;
          if (iVar1 == size) break;
        }
      }
      ps_local._4_4_ = b._4_4_;
    }
    break;
  default:
    ps_local._4_4_ = 0;
  }
  return ps_local._4_4_;
}

Assistant:

int stb_ps_writelist(stb_ps *ps, void **list, int size )
{
   int i,n=0;
   switch (3 & (int) ps) {
      case STB_ps_direct:
         if (ps == NULL || size <= 0) return 0;
         list[0] = ps;
         return 1;
      case STB_ps_bucket: {
         stb_ps_bucket *b = GetBucket(ps);
         for (i=0; i < STB_BUCKET_SIZE; ++i)
            if (b->p[i] != NULL && n < size)
               list[n++] = b->p[i];
         return n;
      }
      case STB_ps_array: {
         stb_ps_array *a = GetArray(ps);
         n = stb_min(size, a->count);
         memcpy(list, a->p, sizeof(*list) * n);
         return n;
      }
      case STB_ps_hash: {
         stb_ps_hash *h = GetHash(ps);
         if (size <= 0) return 0;
         for (i=0; i < h->count; ++i) {
            if (!stb_ps_empty(h->table[i])) {
               list[n++] = h->table[i];
               if (n == size) break;
            }
         }
         return n;
      }
   }
   return 0; /* NOTREACHED */
}